

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O3

void __thiscall
asio::detail::
read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1313:23)>
::operator()(read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1313:23)>
             *this,error_code *ec,size_t bytes_transferred,int start)

{
  state_type sVar1;
  int iVar2;
  socket_type sVar3;
  basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *pbVar4;
  void *pvVar5;
  FtpSession *pFVar6;
  error_category *peVar7;
  undefined4 uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  ulong uVar11;
  reactor_op *op;
  undefined8 uVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  size_t sVar13;
  ulong uVar14;
  ulong __new_size;
  long *in_FS_OFFSET;
  shared_ptr<fineftp::FtpSession::IoFile> local_c8;
  shared_ptr<fineftp::FtpSession::IoFile> local_b8;
  _Any_data local_a8;
  element_type *peStack_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  service_type *local_50;
  executor_type *local_48;
  base_implementation_type *local_40;
  reactive_socket_service_base *local_38;
  
  this->start_ = start;
  __new_size = (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.
               total_consumed_;
  if (start == 1) {
    sVar13 = (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_.
             super_mutable_buffer.size_;
    uVar11 = (ulong)(__new_size <
                     (this->super_base_from_completion_cond<asio::detail::transfer_at_least_t>).
                     completion_condition_.minimum_ && ec->_M_value == 0) << 0x10;
  }
  else {
    __new_size = __new_size + bytes_transferred;
    (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.total_consumed_ =
         __new_size;
    iVar2 = ec->_M_value;
    sVar13 = (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_.
             super_mutable_buffer.size_;
    if (((sVar13 <= __new_size || bytes_transferred == 0 && iVar2 == 0) || (iVar2 != 0)) ||
       ((this->super_base_from_completion_cond<asio::detail::transfer_at_least_t>).
        completion_condition_.minimum_ <= __new_size)) {
      fineftp::std::vector<char,_std::allocator<char>_>::resize
                ((this->handler_).buffer.
                 super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,__new_size);
      if (iVar2 == 0) {
        if (__new_size == 0) {
          return;
        }
        pFVar6 = (this->handler_).me.
                 super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_b8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)
               (this->handler_).buffer.
               super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
        local_b8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (this->handler_).buffer.
             super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_b8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_b8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_b8.
                  super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_b8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_b8.
                  super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_c8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (this->handler_).file.
               super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_c8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (this->handler_).file.
             super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
        if (local_c8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_c8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_c8.
                  super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_c8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_c8.
                  super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_a8._M_unused._M_object =
             (this->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
        local_a8._8_8_ =
             (this->handler_).me.super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_)->_M_use_count + 1;
          }
        }
        peStack_98 = (this->handler_).file.
                     super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
        p_Stack_90 = (this->handler_).file.
                     super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
        if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_90->_M_use_count = p_Stack_90->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_90->_M_use_count = p_Stack_90->_M_use_count + 1;
          }
        }
        local_88 = (this->handler_).data_socket.
                   super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
        p_Stack_80 = (this->handler_).data_socket.
                     super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
        if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_80->_M_use_count = p_Stack_80->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_80->_M_use_count = p_Stack_80->_M_use_count + 1;
          }
        }
        local_68 = (code *)0x0;
        pcStack_60 = (code *)0x0;
        local_78._M_unused._M_object = (void *)0x0;
        local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_78._M_unused._M_object = operator_new(0x30);
        p_Var10 = p_Stack_80;
        p_Var9 = p_Stack_90;
        uVar12 = local_a8._8_8_;
        local_a8._8_8_ = 0;
        (((element_type *)local_78._M_unused._0_8_)->super__Vector_base<char,_std::allocator<char>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8._M_unused._0_8_;
        (((element_type *)local_78._M_unused._0_8_)->super__Vector_base<char,_std::allocator<char>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar12;
        local_a8._M_unused._M_object = (void *)0x0;
        p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (((element_type *)local_78._M_unused._0_8_)->super__Vector_base<char,_std::allocator<char>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)peStack_98;
        (((element_type *)((long)local_78._M_unused._0_8_ + 0x18))->
        super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start =
             (pointer)p_Var9;
        peStack_98 = (element_type *)0x0;
        p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (((element_type *)((long)local_78._M_unused._0_8_ + 0x18))->
        super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_finish =
             (pointer)local_88;
        (((element_type *)((long)local_78._M_unused._0_8_ + 0x18))->
        super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)p_Var10;
        local_88 = (element_type *)0x0;
        pcStack_60 = fineftp::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1327:61)>
                     ::_M_invoke;
        local_68 = fineftp::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1327:61)>
                   ::_M_manager;
        fineftp::FtpSession::writeDataToFile
                  (pFVar6,(shared_ptr<std::vector<char,_std::allocator<char>_>_> *)&local_b8,
                   &local_c8,(function<void_()> *)&local_78);
        if (local_68 != (code *)0x0) {
          (*local_68)((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
        }
        this_00._M_pi =
             local_b8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_c8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c8.
                     super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          this_00._M_pi =
               local_b8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
        }
      }
      else {
        if (__new_size != 0) {
          pFVar6 = (this->handler_).me.
                   super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_78._M_unused._M_object =
               (this->handler_).buffer.
               super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          local_78._8_8_ =
               (this->handler_).buffer.
               super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count +
                   1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count =
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_)->_M_use_count +
                   1;
            }
          }
          local_b8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (this->handler_).file.
                   super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_b8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (this->handler_).file.
               super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          if (local_b8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_b8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_b8.
                    super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_b8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_b8.
                    super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          local_a8._M_unused._M_object = (void *)0x0;
          local_a8._8_8_ = 0;
          p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       fineftp::std::
                       _Function_handler<void_(),_fineftp::FtpSession::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.h:148:74)>
                       ::_M_invoke;
          peStack_98 = (element_type *)
                       fineftp::std::
                       _Function_handler<void_(),_fineftp::FtpSession::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.h:148:74)>
                       ::_M_manager;
          fineftp::FtpSession::writeDataToFile
                    (pFVar6,(shared_ptr<std::vector<char,_std::allocator<char>_>_> *)&local_78,
                     &local_b8,(function<void_()> *)&local_a8);
          if (peStack_98 != (element_type *)0x0) {
            (*(code *)peStack_98)(&local_a8,&local_a8,3);
          }
          if (local_b8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_b8.
                       super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
          }
        }
        pFVar6 = (this->handler_).me.
                 super___shared_ptr<fineftp::FtpSession,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_c8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (this->handler_).file.
               super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_c8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (this->handler_).file.
             super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
        if (local_c8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_c8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_c8.
                  super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_c8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_c8.
                  super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        fineftp::FtpSession::endDataReceiving(pFVar6,&local_c8);
        this_00._M_pi =
             local_c8.super___shared_ptr<fineftp::FtpSession::IoFile,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
      if (this_00._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_pi);
      return;
    }
    uVar11 = 0x10000;
  }
  if (sVar13 < __new_size) {
    __new_size = sVar13;
  }
  pbVar4 = this->stream_;
  pvVar5 = (this->buffers_).super_consuming_single_buffer<asio::mutable_buffers_1>.buffer_.
           super_mutable_buffer.data_;
  uVar14 = sVar13 - __new_size;
  if (uVar11 <= sVar13 - __new_size) {
    uVar14 = uVar11;
  }
  local_50 = (pbVar4->
             super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
             ).impl_.service_;
  local_38 = &local_50->super_reactive_socket_service_base;
  local_40 = &(pbVar4->
              super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ).impl_.implementation_.super_base_implementation_type;
  local_48 = &(pbVar4->
              super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              ).impl_.executor_;
  if (*(long *)(*in_FS_OFFSET + -0x10) == 0) {
    uVar12 = 0;
  }
  else {
    uVar12 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x10) + 8);
  }
  local_a8._M_unused._M_object = this;
  op = (reactor_op *)thread_info_base::allocate<asio::detail::thread_info_base::default_tag>(uVar12)
  ;
  sVar3 = (pbVar4->
          super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ).impl_.implementation_.super_base_implementation_type.socket_;
  sVar1 = (pbVar4->
          super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
          ).impl_.implementation_.super_base_implementation_type.state_;
  (op->super_operation).next_ = (scheduler_operation *)0x0;
  (op->super_operation).func_ =
       reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1313:23)>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
       ::do_complete;
  (op->super_operation).task_result_ = 0;
  uVar8 = *(undefined4 *)&(local_50->super_reactive_socket_service_base).success_ec_.field_0x4;
  peVar7 = (local_50->super_reactive_socket_service_base).success_ec_._M_cat;
  (op->ec_)._M_value = (local_50->super_reactive_socket_service_base).success_ec_._M_value;
  *(undefined4 *)&(op->ec_).field_0x4 = uVar8;
  (op->ec_)._M_cat = peVar7;
  op->bytes_transferred_ = 0;
  op->perform_func_ = reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform;
  *(socket_type *)&op[1].super_operation.next_ = sVar3;
  *(state_type *)((long)&op[1].super_operation.next_ + 4) = sVar1;
  op[1].super_operation.func_ = (func_type)(__new_size + (long)pvVar5);
  *(ulong *)&op[1].super_operation.task_result_ = uVar14;
  op[1].ec_._M_value = 0;
  local_a8._8_8_ = op;
  read_op((read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_continental[P]fineftp_server_fineftp_server_src_ftp_session_cpp:1313:23)>
           *)&op[1].ec_._M_cat,this);
  handler_work_base<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_asio::io_context,_asio::executor,_void>
  ::handler_work_base((handler_work_base<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>,_void,_asio::io_context,_asio::executor,_void>
                       *)&op[3].ec_._M_cat,local_48);
  peStack_98 = (element_type *)op;
  reactive_socket_service_base::start_op
            (local_38,local_40,0,op,start == 0,true,
             (bool)(uVar14 == 0 &
                   (pbVar4->
                   super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   ).impl_.implementation_.super_base_implementation_type.state_ >> 4));
  local_a8._8_8_ = 0;
  peStack_98 = (element_type *)0x0;
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_op<asio::basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/continental[P]fineftp-server/fineftp-server/src/ftp_session.cpp:1313:23)>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::ptr::reset((ptr *)&local_a8);
  return;
}

Assistant:

void operator()(const asio::error_code& ec,
        std::size_t bytes_transferred, int start = 0)
    {
      std::size_t max_size;
      switch (start_ = start)
      {
        case 1:
        max_size = this->check_for_completion(ec, buffers_.total_consumed());
        do
        {
          {
            ASIO_HANDLER_LOCATION((__FILE__, __LINE__, "async_read"));
            stream_.async_read_some(buffers_.prepare(max_size),
                ASIO_MOVE_CAST(read_op)(*this));
          }
          return; default:
          buffers_.consume(bytes_transferred);
          if ((!ec && bytes_transferred == 0) || buffers_.empty())
            break;
          max_size = this->check_for_completion(ec, buffers_.total_consumed());
        } while (max_size > 0);

        handler_(ec, buffers_.total_consumed());
      }
    }